

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hive_partitioning.cpp
# Opt level: O1

void __thiscall
duckdb::HivePartitionedColumnData::HivePartitionedColumnData
          (HivePartitionedColumnData *this,ClientContext *context,
          vector<duckdb::LogicalType,_true> *types,vector<unsigned_long,_true> *partition_by_cols,
          shared_ptr<duckdb::GlobalHivePartitionState,_true> *global_state)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  pointer puVar3;
  pointer pLVar4;
  pointer this_00;
  vector<duckdb::LogicalType,_true> local_58;
  LogicalType local_40;
  
  local_58.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start =
       (types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_58.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_58.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  PartitionedColumnData::PartitionedColumnData
            (&this->super_PartitionedColumnData,HIVE,context,&local_58);
  pLVar4 = local_58.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (this_00 = local_58.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_start; this_00 != pLVar4; this_00 = this_00 + 1)
  {
    LogicalType::~LogicalType(this_00);
  }
  if (local_58.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                    .super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  (this->super_PartitionedColumnData)._vptr_PartitionedColumnData =
       (_func_int **)&PTR__HivePartitionedColumnData_02491d68;
  (this->global_state).internal.
  super___shared_ptr<duckdb::GlobalHivePartitionState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1 = (global_state->internal).
           super___shared_ptr<duckdb::GlobalHivePartitionState,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (global_state->internal).
           super___shared_ptr<duckdb::GlobalHivePartitionState,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (global_state->internal).
  super___shared_ptr<duckdb::GlobalHivePartitionState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->global_state).internal.
  super___shared_ptr<duckdb::GlobalHivePartitionState,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  (this->global_state).internal.
  super___shared_ptr<duckdb::GlobalHivePartitionState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Var2;
  (global_state->internal).
  super___shared_ptr<duckdb::GlobalHivePartitionState,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->local_partition_map)._M_h._M_buckets = &(this->local_partition_map)._M_h._M_single_bucket;
  (this->local_partition_map)._M_h._M_bucket_count = 1;
  (this->local_partition_map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->local_partition_map)._M_h._M_element_count = 0;
  (this->local_partition_map)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->local_partition_map)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->local_partition_map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  puVar3 = (partition_by_cols->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->group_by_columns).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (partition_by_cols->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
  (this->group_by_columns).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = puVar3;
  (this->group_by_columns).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (partition_by_cols->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (partition_by_cols->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (partition_by_cols->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (partition_by_cols->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  LogicalType::LogicalType(&local_40,UBIGINT);
  Vector::Vector(&this->hashes_v,&local_40,0x800);
  LogicalType::~LogicalType(&local_40);
  (this->keys).super_vector<duckdb::HivePartitionKey,_std::allocator<duckdb::HivePartitionKey>_>.
  super__Vector_base<duckdb::HivePartitionKey,_std::allocator<duckdb::HivePartitionKey>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->keys).super_vector<duckdb::HivePartitionKey,_std::allocator<duckdb::HivePartitionKey>_>.
  super__Vector_base<duckdb::HivePartitionKey,_std::allocator<duckdb::HivePartitionKey>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->keys).super_vector<duckdb::HivePartitionKey,_std::allocator<duckdb::HivePartitionKey>_>.
  super__Vector_base<duckdb::HivePartitionKey,_std::allocator<duckdb::HivePartitionKey>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  InitializeKeys(this);
  PartitionedColumnData::CreateAllocator(&this->super_PartitionedColumnData);
  return;
}

Assistant:

HivePartitionedColumnData::HivePartitionedColumnData(ClientContext &context, vector<LogicalType> types,
                                                     vector<idx_t> partition_by_cols,
                                                     shared_ptr<GlobalHivePartitionState> global_state)
    : PartitionedColumnData(PartitionedColumnDataType::HIVE, context, std::move(types)),
      global_state(std::move(global_state)), group_by_columns(std::move(partition_by_cols)),
      hashes_v(LogicalType::HASH) {
	InitializeKeys();
	CreateAllocator();
}